

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::getenvtest::test(getenvtest *this)

{
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  getenvtest *local_10;
  getenvtest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"(getenv \"Jan\")",&local_51);
  compile_fixture::run(&local_30,&this->super_compile_fixture,&local_50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14e1,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"(putenv \"SkiwiTest\" \"DummyValue\")",&local_a9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14e3,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"(getenv \"SkiwiTest\")",&local_f1);
  compile_fixture::run(&local_d0,&this->super_compile_fixture,&local_f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("\"DummyValue\"",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14e4,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"(putenv \"SkiwiTest\" \"DummyValu\")",&local_139);
  compile_fixture::run(&local_118,&this->super_compile_fixture,&local_138,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14e6,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"(getenv \"SkiwiTest\")",&local_181);
  compile_fixture::run(&local_160,&this->super_compile_fixture,&local_180,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("\"DummyValu\"",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14e7,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"(putenv \"SkiwiTest\" \"DummyVal\")",&local_1c9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_1c8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14e9,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"(getenv \"SkiwiTest\")",&local_211);
  compile_fixture::run(&local_1f0,&this->super_compile_fixture,&local_210,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("\"DummyVal\"",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14ea,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"(putenv \"SkiwiTest\" \"DummyVa\")",&local_259);
  compile_fixture::run(&local_238,&this->super_compile_fixture,&local_258,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14ec,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"(getenv \"SkiwiTest\")",&local_2a1);
  compile_fixture::run(&local_280,&this->super_compile_fixture,&local_2a0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("\"DummyVa\"",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14ed,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"(putenv \"SkiwiTest\" \"DummyV\")",&local_2e9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_2e8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14ef,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"(getenv \"SkiwiTest\")",&local_331);
  compile_fixture::run(&local_310,&this->super_compile_fixture,&local_330,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("\"DummyV\"",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14f0,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"(putenv \"SkiwiTest\" \"Dummy\")",&local_379);
  compile_fixture::run(&local_358,&this->super_compile_fixture,&local_378,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14f2,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"(getenv \"SkiwiTest\")",&local_3c1);
  compile_fixture::run(&local_3a0,&this->super_compile_fixture,&local_3c0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("\"Dummy\"",&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14f3,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"(putenv \"SkiwiTest\" \"\")",&local_409);
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_408,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14f5,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"(getenv \"SkiwiTest\")",&local_451);
  compile_fixture::run(&local_430,&this->super_compile_fixture,&local_450,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("\"\"",&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14fa,"void skiwi::(anonymous namespace)::getenvtest::test()");
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  return;
}

Assistant:

void test()
      {
      TEST_EQ("#f", run("(getenv \"Jan\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"DummyValue\")"));
      TEST_EQ("\"DummyValue\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"DummyValu\")"));
      TEST_EQ("\"DummyValu\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"DummyVal\")"));
      TEST_EQ("\"DummyVal\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"DummyVa\")"));
      TEST_EQ("\"DummyVa\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"DummyV\")"));
      TEST_EQ("\"DummyV\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"Dummy\")"));
      TEST_EQ("\"Dummy\"", run("(getenv \"SkiwiTest\")"));

      TEST_EQ("#t", run("(putenv \"SkiwiTest\" \"\")"));

#ifdef _WIN32
      TEST_EQ("#f", run("(getenv \"SkiwiTest\")"));
#else
      TEST_EQ("\"\"", run("(getenv \"SkiwiTest\")"));
#endif
      }